

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems
          (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__return_storage_ptr__,Tensor *this)

{
  undefined8 *puVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *bs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_c8;
  Tensor *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  float *pfStack_80;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar3 = (ulong)(this->d).bd;
  if (uVar3 == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,1,this,(allocator_type *)&local_a8);
  }
  else {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,uVar3,(allocator_type *)&local_a8);
    uVar3 = (ulong)(this->d).nd;
    iVar5 = 1;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        iVar5 = iVar5 * (this->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    local_58 = *(undefined8 *)(this->d).d;
    uStack_50 = *(undefined8 *)((this->d).d + 2);
    local_48 = *(undefined8 *)((this->d).d + 4);
    uStack_40 = *(undefined8 *)((this->d).d + 6);
    if ((this->d).bd != 0) {
      lVar6 = 0x40;
      uVar3 = 0;
      uVar4 = 0;
      local_b0 = this;
      do {
        pfStack_80 = this->v + uVar3;
        local_98 = local_48;
        uStack_90 = uStack_40;
        local_a8 = local_58;
        uStack_a0 = uStack_50;
        local_88 = 1;
        pTVar2 = (__return_storage_ptr__->
                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x20);
        *puVar1 = CONCAT44(uStack_84,1);
        puVar1[1] = pfStack_80;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x30);
        *puVar1 = local_48;
        puVar1[1] = uStack_40;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x40);
        *puVar1 = local_58;
        puVar1[1] = uStack_50;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x10);
        local_c8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_c8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        local_c8.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)(pTVar2->d).d + lVar6);
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)(pTVar2->d).d + lVar6) = 0;
        local_78.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_c8);
        this = local_b0;
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78);
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 0x48;
        uVar3 = (ulong)(uint)((int)uVar3 + iVar5);
      } while (uVar4 < (this->d).bd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }